

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoLinear>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoLinear> *this,TPZGeoLinear *geo,int matind,TPZGeoMesh *mesh
          )

{
  TPZGeoEl *in_RDI;
  int i;
  TPZGeoElSideIndex *in_stack_ffffffffffffff50;
  TPZGeoMesh *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  void **in_stack_ffffffffffffff68;
  TPZGeoEl *in_stack_ffffffffffffff70;
  int64_t *local_78;
  TPZGeoElSideIndex local_58;
  int local_40;
  undefined8 local_30;
  undefined8 local_28;
  
  local_28 = 0;
  local_30 = 0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZGeoLinear>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02444290);
  TPZGeoEl::TPZGeoEl(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                     in_stack_ffffffffffffff58);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02443f78;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02443f78;
  pzgeom::TPZGeoLinear::TPZGeoLinear
            ((TPZGeoLinear *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (TPZGeoLinear *)in_stack_ffffffffffffff58);
  local_78 = (int64_t *)&in_RDI[1].fMatId;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff50);
    local_78 = local_78 + 3;
  } while ((TPZCompEl **)local_78 != &in_RDI[2].fReference);
  for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff50);
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(&in_RDI[1].fMatId + (long)local_40 * 6),&local_58);
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x1bb78d0);
  }
  pzgeom::TPZNodeRep<2,_pztopology::TPZLine>::Initialize
            ((TPZNodeRep<2,_pztopology::TPZLine> *)(in_RDI + 1),in_RDI);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TGeo &geo,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh), fGeo(geo) {
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}